

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O0

string * __thiscall
deqp::gls::fboc::details::RenderableParams::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,RenderableParams *this,RenderableParams *params)

{
  RenderableParams *params_local;
  
  formatDesc_abi_cxx11_(__return_storage_ptr__,(details *)this->format,(ImageFormat)params);
  return __return_storage_ptr__;
}

Assistant:

static string		getDescription		(const RenderableParams& params)
	{
		return formatDesc(params.format);
	}